

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

TypeT __thiscall
wasm::WATParser::anon_unknown_11::ParseTypeDefsCtx::makeTupleType
          (ParseTypeDefsCtx *this,vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  TypeBuilder *this_00;
  Type TVar1;
  Tuple local_30;
  
  this_00 = this->builder;
  Tuple::Tuple(&local_30,types);
  TVar1 = TypeBuilder::getTempTupleType(this_00,&local_30);
  if (local_30.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TypeT)TVar1.id;
}

Assistant:

TypeT makeTupleType(const std::vector<Type> types) {
    return builder.getTempTupleType(types);
  }